

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase623::run(TestCase623 *this)

{
  TaskSet **this_00;
  bool bVar1;
  int iVar2;
  Timer *pTVar3;
  undefined4 extraout_var;
  __sighandler_t p_Var4;
  int *piVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool local_1f1;
  Quantity<long,_kj::_::NanosecondLabel> QStack_1f0;
  bool _kj_shouldLog_2;
  Quantity<long,_kj::_::NanosecondLabel> local_1e8;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> local_1e0;
  long local_1d8;
  bool local_1c9;
  Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel> AStack_1c8;
  bool _kj_shouldLog_1;
  long local_1c0;
  bool local_1b1;
  Exception *pEStack_1b0;
  bool _kj_shouldLog;
  Promise<void> local_1a8;
  undefined1 auStack_198 [8];
  itimerval itv;
  Fault local_170;
  Fault f;
  Quantity<long,_kj::_::NanosecondLabel> timeout;
  TimePoint start;
  Timer *timer;
  undefined1 local_148 [4];
  int OS_SLOWNESS_FACTOR;
  WaitScope waitScope;
  undefined1 local_128 [8];
  EventLoop loop;
  UnixEventPort port;
  TestCase623 *this_local;
  
  captureSignals();
  this_00 = &loop.daemons.ptr;
  UnixEventPort::UnixEventPort((UnixEventPort *)this_00);
  EventLoop::EventLoop((EventLoop *)local_128,(EventPort *)this_00);
  WaitScope::WaitScope((WaitScope *)local_148,(EventLoop *)local_128);
  pTVar3 = UnixEventPort::getTimer((UnixEventPort *)&loop.daemons.ptr);
  iVar2 = (**pTVar3->_vptr_Timer)();
  timeout.value = CONCAT44(extraout_var,iVar2);
  f.exception = (Exception *)0x5f5e100;
  (anonymous_namespace)::dummySignalHandlerCalled = 0;
  p_Var4 = signal(0xe,dummySignalHandler);
  if (p_Var4 != (__sighandler_t)0xffffffffffffffff) {
    itv.it_interval.tv_usec = 0;
    auStack_198 = (undefined1  [8])0x0;
    itv.it_interval.tv_sec = 0;
    itv.it_value.tv_sec = 50000;
    setitimer(ITIMER_REAL,(itimerval *)auStack_198,(itimerval *)0x0);
    pEStack_1b0 = f.exception;
    (*pTVar3->_vptr_Timer[2])(&local_1a8,pTVar3,f.exception);
    Promise<void>::wait(&local_1a8,local_148);
    Promise<void>::~Promise(&local_1a8);
    if (((anonymous_namespace)::dummySignalHandlerCalled & 1) == 0) {
      local_1b1 = _::Debug::shouldLog(ERROR);
      while (local_1b1 != false) {
        _::Debug::log<char_const(&)[42]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x291,ERROR,"\"failed: expected \" \"dummySignalHandlerCalled\"",
                   (char (*) [42])"failed: expected dummySignalHandlerCalled");
        local_1b1 = false;
      }
    }
    AStack_1c8.value.value._0_4_ = (**pTVar3->_vptr_Timer)();
    AStack_1c8.value.value._4_4_ = extraout_var_00;
    local_1c0 = (long)Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::
                      operator-(&AStack_1c8,
                                (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
                                 *)&timeout);
    bVar1 = Quantity<long,kj::_::NanosecondLabel>::operator>=
                      ((Quantity<long,kj::_::NanosecondLabel> *)&local_1c0,
                       (Quantity<long,_kj::_::NanosecondLabel> *)&f);
    if (!bVar1) {
      local_1c9 = _::Debug::shouldLog(ERROR);
      while (local_1c9 != false) {
        _::Debug::log<char_const(&)[48]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x292,ERROR,"\"failed: expected \" \"timer.now() - start >= timeout\"",
                   (char (*) [48])"failed: expected timer.now() - start >= timeout");
        local_1c9 = false;
      }
    }
    local_1e0.value.value._0_4_ = (**pTVar3->_vptr_Timer)();
    local_1e0.value.value._4_4_ = extraout_var_01;
    local_1d8 = (long)Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>::
                      operator-(&local_1e0,
                                (Absolute<kj::Quantity<long,_kj::_::NanosecondLabel>,_kj::_::TimeLabel>
                                 *)&timeout);
    QStack_1f0 = Quantity<long,_kj::_::NanosecondLabel>::operator/<int,_void>
                           ((Quantity<long,_kj::_::NanosecondLabel> *)&f,5);
    local_1e8 = Quantity<long,_kj::_::NanosecondLabel>::operator+<long>
                          ((Quantity<long,_kj::_::NanosecondLabel> *)&f,&stack0xfffffffffffffe10);
    bVar1 = Quantity<long,kj::_::NanosecondLabel>::operator<=
                      ((Quantity<long,kj::_::NanosecondLabel> *)&local_1d8,&local_1e8);
    if (!bVar1) {
      local_1f1 = _::Debug::shouldLog(ERROR);
      while (local_1f1 != false) {
        _::Debug::log<char_const(&)[64]>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x293,ERROR,
                   "\"failed: expected \" \"timer.now() - start <= timeout + (timeout / 5)\"",
                   (char (*) [64])"failed: expected timer.now() - start <= timeout + (timeout / 5)")
        ;
        local_1f1 = false;
      }
    }
    WaitScope::~WaitScope((WaitScope *)local_148);
    EventLoop::~EventLoop((EventLoop *)local_128);
    UnixEventPort::~UnixEventPort((UnixEventPort *)&loop.daemons.ptr);
    return;
  }
  piVar5 = __errno_location();
  _::Debug::Fault::Fault
            (&local_170,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix-test.c++"
             ,0x288,*piVar5,"signal(SIGALRM)","");
  _::Debug::Fault::fatal(&local_170);
}

Assistant:

TEST(AsyncUnixTest, InterruptedTimer) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

#if __linux__
  // Linux timeslices are 1ms.
  constexpr auto OS_SLOWNESS_FACTOR = 1;
#else
  // OSX timeslices are 10ms, so we need longer timeouts to avoid flakiness.
  // To be safe we'll assume other OS's are similar.
  constexpr auto OS_SLOWNESS_FACTOR = 10;
#endif

  // Schedule a timer event in 100ms.
  auto& timer = port.getTimer();
  auto start = timer.now();
  constexpr auto timeout = 100 * MILLISECONDS * OS_SLOWNESS_FACTOR;

  // Arrange SIGALRM to be delivered in 50ms, handled in an empty signal handler. This will cause
  // our wait to be interrupted with EINTR. We should nevertheless continue waiting for the right
  // amount of time.
  dummySignalHandlerCalled = false;
  if (signal(SIGALRM, &dummySignalHandler) == SIG_ERR) {
    KJ_FAIL_SYSCALL("signal(SIGALRM)", errno);
  }
  struct itimerval itv;
  memset(&itv, 0, sizeof(itv));
  itv.it_value.tv_usec = 50000 * OS_SLOWNESS_FACTOR;  // signal after 50ms
  setitimer(ITIMER_REAL, &itv, nullptr);

  timer.afterDelay(timeout).wait(waitScope);

  KJ_EXPECT(dummySignalHandlerCalled);
  KJ_EXPECT(timer.now() - start >= timeout);
  KJ_EXPECT(timer.now() - start <= timeout + (timeout / 5));  // allow 20ms error
}